

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::finalize_prediction(shared_data *sd,float ret)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  long in_RDI;
  float in_XMM0_Da;
  float local_4;
  
  bVar1 = nanpattern(0.0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"NAN prediction in example ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(long *)(in_RDI + 8) + 1);
    poVar2 = std::operator<<(poVar2,", forcing ");
    this = (void *)std::ostream::operator<<(poVar2,0.0);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0.0;
  }
  else if (in_XMM0_Da < *(float *)(in_RDI + 0x6c) || in_XMM0_Da == *(float *)(in_RDI + 0x6c)) {
    local_4 = in_XMM0_Da;
    if (in_XMM0_Da < *(float *)(in_RDI + 0x68)) {
      local_4 = *(float *)(in_RDI + 0x68);
    }
  }
  else {
    local_4 = *(float *)(in_RDI + 0x6c);
  }
  return local_4;
}

Assistant:

float finalize_prediction(shared_data* sd, float ret)
{
  if (nanpattern(ret))
  {
    ret = 0.;
    cerr << "NAN prediction in example " << sd->example_number + 1 << ", forcing " << ret << endl;
    return ret;
  }
  if (ret > sd->max_label)
    return (float)sd->max_label;
  if (ret < sd->min_label)
    return (float)sd->min_label;
  return ret;
}